

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  OpCode o;
  int iVar1;
  uint a;
  
  switch(var->k) {
  case VLOCAL:
    freeexp(fs,ex);
    exp2reg(fs,ex,(uint)(var->u).var.ridx);
    return;
  case VUPVAL:
    iVar1 = luaK_exp2anyreg(fs,ex);
    luaK_code(fs,(var->u).info << 0x10 | iVar1 << 7 | 10);
  default:
    goto switchD_00133851_caseD_b;
  case VINDEXED:
    a = (uint)(var->u).ind.t;
    iVar1 = (int)(var->u).ind.idx;
    o = OP_SETTABLE;
    break;
  case VINDEXUP:
    a = (uint)(var->u).ind.t;
    iVar1 = (int)(var->u).ind.idx;
    o = OP_SETTABUP;
    break;
  case VINDEXI:
    a = (uint)(var->u).ind.t;
    iVar1 = (int)(var->u).ind.idx;
    o = OP_SETI;
    break;
  case VINDEXSTR:
    a = (uint)(var->u).ind.t;
    iVar1 = (int)(var->u).ind.idx;
    o = OP_SETFIELD;
  }
  codeABRK(fs,o,a,iVar1,ex);
switchD_00133851_caseD_b:
  freeexp(fs,ex);
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.var.ridx);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      luaK_codeABC(fs, OP_SETUPVAL, e, var->u.info, 0);
      break;
    }
    case VINDEXUP: {
      codeABRK(fs, OP_SETTABUP, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXI: {
      codeABRK(fs, OP_SETI, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXSTR: {
      codeABRK(fs, OP_SETFIELD, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXED: {
      codeABRK(fs, OP_SETTABLE, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}